

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall rw::Frame::updateObjects(Frame *this)

{
  LLLink *pLVar1;
  uint8 *puVar2;
  byte bVar3;
  Frame *pFVar4;
  LLLink *pLVar5;
  long lVar6;
  
  lVar6 = engine;
  pFVar4 = this->root;
  bVar3 = (pFVar4->object).privateFlags;
  if ((bVar3 & 3) == 0) {
    pLVar1 = (LLLink *)(engine + 0x10);
    pLVar5 = *(LLLink **)(engine + 0x10);
    (pFVar4->inDirtyList).next = pLVar5;
    (pFVar4->inDirtyList).prev = pLVar1;
    pLVar5->prev = &pFVar4->inDirtyList;
    *(LLLink **)(lVar6 + 0x10) = &pFVar4->inDirtyList;
  }
  (pFVar4->object).privateFlags = bVar3 | 3;
  puVar2 = &(this->object).privateFlags;
  *puVar2 = *puVar2 | 0xc;
  return;
}

Assistant:

void
Frame::updateObjects(void)
{
	// Mark root as dirty and insert into dirty list if necessary
	if((this->root->object.privateFlags & HIERARCHYSYNC) == 0)
		engine->frameDirtyList.add(&this->root->inDirtyList);
	this->root->object.privateFlags |= HIERARCHYSYNC;
	// Mark subtree as dirty as well
	this->object.privateFlags |= SUBTREESYNC;
}